

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZParFrontMatrix.cpp
# Opt level: O0

void __thiscall
TPZParFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontNonSym<double>_>::TPZParFrontMatrix
          (TPZParFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontNonSym<double>_> *this)

{
  TPZRegisterClassId *in_RDI;
  TPZFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontNonSym<double>_> *unaff_retaddr;
  int64_t newsize;
  TPZManVector<TPZEqnArray<double>_*,_10> *this_00;
  TPZRegisterClassId *vtt;
  
  this_00 = (TPZManVector<TPZEqnArray<double>_*,_10> *)0x0;
  newsize = 0x21;
  vtt = in_RDI;
  TPZRegisterClassId::
  TPZRegisterClassId<TPZParFrontMatrix<double,TPZStackEqnStorage<double>,TPZFrontNonSym<double>>>
            (in_RDI,0x21);
  TPZFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontNonSym<double>_>::TPZFrontMatrix
            (unaff_retaddr,(void **)vtt);
  *(undefined ***)in_RDI = &PTR__TPZParFrontMatrix_025530c8;
  TPZStack<TPZEqnArray<double>_*,_10>::TPZStack
            ((TPZStack<TPZEqnArray<double>_*,_10> *)(in_RDI + 0x1fb60));
  *(undefined4 *)(in_RDI + 130000) = 0;
  *(undefined8 *)(in_RDI + 0x1fbe8) = 0;
  *(undefined8 *)(in_RDI + 0x1fbf0) = 0;
  *(undefined8 *)(in_RDI + 0x1fbd8) = 0;
  *(undefined8 *)(in_RDI + 0x1fbe0) = 0;
  *(undefined8 *)(in_RDI + 0x1fbf8) = 0;
  std::mutex::mutex((mutex *)0x1d3c629);
  std::condition_variable::condition_variable((condition_variable *)(in_RDI + 0x1fc00));
  TPZManVector<TPZEqnArray<double>_*,_10>::Resize(this_00,newsize);
  return;
}

Assistant:

TPZParFrontMatrix<TVar, store, front>::TPZParFrontMatrix():
TPZRegisterClassId(&TPZParFrontMatrix::ClassId), fFinish(0), fwritelock(), fwritecond()
{
	fEqnStack.Resize(0);
}